

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_BOOL ref_phys_wall_distance_bc(REF_INT bc)

{
  REF_BOOL RVar1;
  
  RVar1 = 1;
  if (bc < 4000) {
    if (((bc == -0x100e) || (bc == -0x1004)) || (bc == -4000)) {
      return RVar1;
    }
  }
  else {
    if ((bc - 0xfebU < 0x24) && ((0x802000001U >> ((ulong)(bc - 0xfebU) & 0x3f) & 1) != 0)) {
      return RVar1;
    }
    if (bc == 4000) {
      return RVar1;
    }
    if (bc == 0x1838) {
      return RVar1;
    }
  }
  return (REF_BOOL)(bc == 0x1842);
}

Assistant:

REF_FCN REF_BOOL ref_phys_wall_distance_bc(REF_INT bc) {
  return (bc == 4000 ||  /* viscous_solid */
          bc == -4000 || /* viscous_solid_trs */
          bc == 4075 ||  /* viscous_wall_rough */
          bc == 4100 ||  /* viscous_wall_function */
          bc == 4110 ||  /* viscous_weak_wall */
          bc == -4110 || /* viscous_weak_trs */
          bc == -4100 || /* viscous_wf_trs */
          bc == 6200 ||  /* block_interface */
          bc == 6210);   /* filter */
}